

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_readStats_wksp(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                         U32 *tableLogPtr,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                         int flags)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if ((flags & 1U) != 0) {
    sVar3 = HUF_readStats_body_bmi2
                      (huffWeight,hwSize,rankStats,nbSymbolsPtr,tableLogPtr,src,srcSize,workSpace,
                       wkspSize);
    return sVar3;
  }
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  uVar4 = (ulong)*src;
  if ((char)*src < '\0') {
    uVar6 = uVar4 - 0x7e >> 1;
    if (srcSize <= uVar6) {
      return 0xffffffffffffffb8;
    }
    sVar3 = uVar4 - 0x7f;
    if (hwSize <= sVar3) {
      return 0xffffffffffffffec;
    }
    if (sVar3 == 0) {
      rankStats[8] = 0;
      rankStats[9] = 0;
      rankStats[10] = 0;
      rankStats[0xb] = 0;
      rankStats[4] = 0;
      rankStats[5] = 0;
      rankStats[6] = 0;
      rankStats[7] = 0;
      rankStats[0] = 0;
      rankStats[1] = 0;
      rankStats[2] = 0;
      rankStats[3] = 0;
      rankStats[0xc] = 0;
      return 0xffffffffffffffec;
    }
    pbVar9 = (byte *)((long)src + 1);
    uVar4 = 0;
    do {
      huffWeight[uVar4] = *pbVar9 >> 4;
      huffWeight[uVar4 + 1] = *pbVar9 & 0xf;
      uVar4 = uVar4 + 2;
      pbVar9 = pbVar9 + 1;
    } while (uVar4 < sVar3);
  }
  else {
    if (srcSize <= uVar4) {
      return 0xffffffffffffffb8;
    }
    sVar3 = FSE_decompress_wksp_bmi2
                      (huffWeight,hwSize - 1,(void *)((long)src + 1),uVar4,6,workSpace,wkspSize,0);
    uVar6 = uVar4;
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
  }
  rankStats[8] = 0;
  rankStats[9] = 0;
  rankStats[10] = 0;
  rankStats[0xb] = 0;
  rankStats[4] = 0;
  rankStats[5] = 0;
  rankStats[6] = 0;
  rankStats[7] = 0;
  rankStats[0] = 0;
  rankStats[1] = 0;
  rankStats[2] = 0;
  rankStats[3] = 0;
  rankStats[0xc] = 0;
  sVar5 = 0xffffffffffffffec;
  if (sVar3 != 0) {
    uVar7 = 0;
    uVar4 = 0;
    uVar8 = 1;
    do {
      if (0xc < (ulong)huffWeight[uVar4]) {
        return 0xffffffffffffffec;
      }
      rankStats[huffWeight[uVar4]] = rankStats[huffWeight[uVar4]] + 1;
      uVar7 = uVar7 + ((1 << (huffWeight[uVar4] & 0x1f)) >> 1);
      bVar1 = uVar8 < sVar3;
      uVar4 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar1);
    if (uVar7 != 0) {
      uVar2 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      if (uVar2 < 0xc) {
        *tableLogPtr = 0x20 - (uVar2 ^ 0x1f);
        uVar7 = (2 << ((byte)uVar2 & 0x1f)) - uVar7;
        uVar2 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        if (1 << ((byte)uVar2 & 0x1f) == uVar7) {
          uVar7 = 0x20 - (uVar2 ^ 0x1f);
          huffWeight[sVar3] = (BYTE)uVar7;
          rankStats[uVar7] = rankStats[uVar7] + 1;
          if ((rankStats[1] & 1) == 0 && 1 < rankStats[1]) {
            *nbSymbolsPtr = (int)sVar3 + 1;
            sVar5 = uVar6 + 1;
          }
        }
      }
    }
  }
  return sVar5;
}

Assistant:

size_t HUF_readStats_wksp(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize,
                     int flags)
{
#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        return HUF_readStats_body_bmi2(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
    }
#endif
    (void)flags;
    return HUF_readStats_body_default(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
}